

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O3

void __thiscall TSDemuxer::~TSDemuxer(TSDemuxer *this)

{
  ~TSDemuxer(this);
  operator_delete(this,0x2390);
  return;
}

Assistant:

TSDemuxer::~TSDemuxer() { m_bufferedReader->deleteReader(m_readerID); }